

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O1

void __thiscall Js::InterpreterStackFrame::Setup::SetupInternal(Setup *this)

{
  Type TVar1;
  FunctionBody *this_00;
  NestedArray *pNVar2;
  code *pcVar3;
  bool bVar4;
  uint32 uVar5;
  RegSlot RVar6;
  int iVar7;
  uint uVar8;
  void **in_RAX;
  ScriptFunction *pSVar9;
  ScriptFunctionWithInlineCache *pSVar10;
  undefined4 *puVar11;
  void **ppvVar12;
  int iVar13;
  uint uVar14;
  void **local_28;
  
  pSVar9 = this->function;
  local_28 = in_RAX;
  if (((pSVar9->hasInlineCaches == true) &&
      (bVar4 = VarIs<Js::ScriptFunction,Js::RecyclableObject>((RecyclableObject *)pSVar9), bVar4))
     && (pSVar9 = UnsafeVarTo<Js::ScriptFunction,Js::RecyclableObject>((RecyclableObject *)pSVar9),
        pSVar9->hasInlineCaches == true)) {
    pSVar10 = VarTo<Js::ScriptFunctionWithInlineCache,Js::ScriptFunction>(this->function);
    ppvVar12 = (pSVar10->m_inlineCaches).ptr;
    Memory::Recycler::WBSetBit((char *)&local_28);
    local_28 = ppvVar12;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(&local_28);
    this->inlineCaches = local_28;
    if (local_28 == (void **)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar11 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar11 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InterpreterStackFrame.cpp"
                                  ,0x44e,"(this->inlineCaches != nullptr)",
                                  "this->inlineCaches != nullptr");
      if (!bVar4) goto LAB_00985aef;
      *puVar11 = 0;
    }
  }
  else {
    ppvVar12 = FunctionBody::GetInlineCaches(this->executeFunction);
    this->inlineCaches = ppvVar12;
  }
  uVar5 = FunctionBody::GetCountField(this->executeFunction,InlineCacheCount);
  this->inlineCacheCount = uVar5;
  RVar6 = FunctionBody::GetLocalsCount(this->executeFunction);
  this->localCount = RVar6;
  bVar4 = DynamicProfileInfo::EnableImplicitCallFlags(this->executeFunction);
  iVar13 = 0x2c;
  if (bVar4) {
    uVar5 = FunctionBody::GetCountField(this->executeFunction,LoopCount);
    iVar13 = (int)((ulong)uVar5 + 7 >> 3) + 0x2c;
  }
  if ((this->bailedOut != true) || (iVar7 = 0, this->isGeneratorFrame == true)) {
    uVar5 = FunctionBody::GetCountField(this->executeFunction,ForInLoopDepth);
    iVar7 = uVar5 * 0xb;
  }
  uVar8 = this->localCount;
  RVar6 = FunctionBody::GetOutParamMaxDepth(this->executeFunction);
  uVar5 = FunctionBody::GetCountField(this->executeFunction,InnerScopeCount);
  this->varAllocCount = uVar5 + RVar6 + iVar13 + iVar7 + uVar8;
  this->stackVarAllocCount = 0;
  this_00 = this->executeFunction;
  if (((((this_00->super_ParseableFunctionInfo).flags & Flags_StackNestedFunc) != Flags_None) &&
      (pNVar2 = (this_00->super_ParseableFunctionInfo).nestedArray.ptr, pNVar2 != (NestedArray *)0x0
      )) && (pNVar2->nestedCount != 0)) {
    if (pNVar2 == (NestedArray *)0x0) {
      uVar8 = 0;
    }
    else {
      uVar8 = pNVar2->nestedCount * 10;
    }
    this->stackVarAllocCount = uVar8;
    if (this->bailedOutOfInlinee != false) {
      return;
    }
    bVar4 = FunctionBody::DoStackFrameDisplay(this_00);
    if (bVar4) {
      uVar14 = (uint)this->executeFunction->m_envDepth;
      if (uVar14 == 0xffff) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar11 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar11 = 1;
        bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InterpreterStackFrame.cpp"
                                    ,0x474,"(envDepth != (uint16)-1)","envDepth != (uint16)-1");
        if (!bVar4) goto LAB_00985aef;
        *puVar11 = 0;
      }
      this->stackVarAllocCount = this->stackVarAllocCount + uVar14 + 2;
    }
    bVar4 = FunctionBody::DoStackScopeSlots(this->executeFunction);
    if (bVar4) {
      TVar1 = (this->executeFunction->super_ParseableFunctionInfo).scopeSlotArraySize;
      if (TVar1 == 0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar11 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar11 = 1;
        bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InterpreterStackFrame.cpp"
                                    ,0x47b,"(scopeSlots != 0)","scopeSlots != 0");
        if (!bVar4) {
LAB_00985aef:
          pcVar3 = (code *)invalidInstructionException();
          (*pcVar3)();
        }
        *puVar11 = 0;
      }
      this->stackVarAllocCount = this->stackVarAllocCount + TVar1 + 2;
    }
  }
  return;
}

Assistant:

void InterpreterStackFrame::Setup::SetupInternal()
    {
        if (this->function->GetHasInlineCaches() && Js::VarIs<Js::ScriptFunctionWithInlineCache>(this->function))
        {
            this->inlineCaches = (void**)Js::VarTo<Js::ScriptFunctionWithInlineCache>(this->function)->GetInlineCaches();
            Assert(this->inlineCaches != nullptr);
        }
        else
        {
            this->inlineCaches = this->executeFunction->GetInlineCaches();
        }
        this->inlineCacheCount = this->executeFunction->GetInlineCacheCount();

        //
        // Compute the amount of memory needed on the stack:
        // - We compute this in 'Atoms' instead of 'bytes' to keep everything natural word aligned.
        //

        this->localCount = this->executeFunction->GetLocalsCount();
        uint extraVarCount = 0;
#if ENABLE_PROFILE_INFO
        if (Js::DynamicProfileInfo::EnableImplicitCallFlags(this->executeFunction))
        {
            extraVarCount += (sizeof(ImplicitCallFlags) * this->executeFunction->GetLoopCount() + sizeof(Var) - 1) / sizeof(Var);
        }
#endif
        // If we bailed out, we will use the JIT frame's for..in enumerators.
        // But for generators, we will allocate space for them instead.
        uint forInVarCount = (bailedOut && !isGeneratorFrame) ? 0 : (this->executeFunction->GetForInLoopDepth() * (sizeof(Js::ForInObjectEnumerator) / sizeof(Var)));
        this->varAllocCount = k_stackFrameVarCount + localCount + this->executeFunction->GetOutParamMaxDepth() + forInVarCount +
            extraVarCount + this->executeFunction->GetInnerScopeCount();
        this->stackVarAllocCount = 0;

        if (this->executeFunction->DoStackNestedFunc() && this->executeFunction->GetNestedCount() != 0)
        {
            // Track stack funcs...
            this->stackVarAllocCount += (sizeof(StackScriptFunction) * this->executeFunction->GetNestedCount()) / sizeof(Var);
            if (!this->bailedOutOfInlinee)
            {
                // Frame display (if environment depth is statically known)...
                if (this->executeFunction->DoStackFrameDisplay())
                {
                    uint16 envDepth = this->executeFunction->GetEnvDepth();
                    Assert(envDepth != (uint16)-1);
                    this->stackVarAllocCount += sizeof(FrameDisplay) / sizeof(Var) + (envDepth + 1);
                }
                // ...and scope slots (if any)
                if (this->executeFunction->DoStackScopeSlots())
                {
                    uint32 scopeSlots = this->executeFunction->scopeSlotArraySize;
                    Assert(scopeSlots != 0);
                    this->stackVarAllocCount += scopeSlots + Js::ScopeSlots::FirstSlotIndex;
                }
            }
        }
    }